

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O0

void __thiscall LinuxRawSocket::~LinuxRawSocket(LinuxRawSocket *this)

{
  int in_ESI;
  SocketImpl *in_RDI;
  
  in_RDI->_vptr_SocketImpl = (_func_int **)&PTR__LinuxRawSocket_00113ca0;
  PosixSocketCommon::shutdown(*(int *)&in_RDI[1]._vptr_SocketImpl,in_ESI);
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  SocketImpl::~SocketImpl(in_RDI);
  return;
}

Assistant:

LinuxRawSocket::~LinuxRawSocket()
{
    PosixSocketCommon::shutdown(socket_fd);
}